

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_facade.cpp
# Opt level: O1

Model * __thiscall Clasp::ClaspFacade::Summary::model(Summary *this)

{
  ulong *puVar1;
  Model *pMVar2;
  ulong uVar3;
  
  puVar1 = (ulong *)((this->facade->solve_).ptr_ & 0xfffffffffffffffe);
  if (puVar1 != (ulong *)0x0) {
    uVar3 = *puVar1 & 0xfffffffffffffffe;
    pMVar2 = (Model *)(uVar3 + 0x48);
    if (uVar3 == 0) {
      pMVar2 = (Model *)0x0;
    }
    return pMVar2;
  }
  return (Model *)0x0;
}

Assistant:

const Model* ClaspFacade::Summary::model() const { return facade->solve_.get() ? facade->solve_->lastModel() : 0; }